

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O2

QpVector * __thiscall
Basis::Ztprod(Basis *this,QpVector *rhs,QpVector *target,bool buffer,HighsInt q)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  size_t i;
  ulong uVar8;
  
  ftran(this,rhs,&this->Ztprod_res,buffer,q);
  QpVector::reset(target);
  piVar2 = (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  piVar3 = (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  piVar4 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar5 = (target->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->Ztprod_res).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar8 = 0; uVar8 < (ulong)((long)piVar2 - (long)piVar3 >> 2); uVar8 = uVar8 + 1) {
    iVar1 = piVar4[piVar3[uVar8]];
    piVar5[uVar8] = (int)uVar8;
    pdVar6[uVar8] = pdVar7[iVar1];
  }
  QpVector::resparsify(target);
  return target;
}

Assistant:

QpVector& Basis::Ztprod(const QpVector& rhs, QpVector& target, bool buffer,
                        HighsInt q) {
  ftran(rhs, Ztprod_res, buffer, q);

  target.reset();
  for (size_t i = 0; i < non_active_constraint_index.size(); i++) {
    HighsInt nonactive = non_active_constraint_index[i];
    HighsInt idx = constraintindexinbasisfactor[nonactive];
    target.index[i] = static_cast<HighsInt>(i);
    target.value[i] = Ztprod_res.value[idx];
  }
  target.resparsify();
  return target;
}